

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

string * __thiscall
netlist::resolveSymbolHierPath_abi_cxx11_
          (string *__return_storage_ptr__,netlist *this,Symbol *symbol)

{
  __const_iterator __i2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string newSuffix;
  string oldSuffix;
  undefined8 local_28;
  undefined8 local_20;
  
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_(__return_storage_ptr__,(Symbol *)this);
  if (*(int *)this == 0x2d) {
    newSuffix._M_string_length = *(size_type *)(*(long *)(*(long *)(this + 0x20) + 8) + 8);
    newSuffix._M_dataplus._M_p = *(pointer *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x10);
    newSuffix.field_2._8_8_ = *(undefined8 *)(this + 8);
    newSuffix.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x10);
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x6;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&newSuffix;
    ::fmt::v11::vformat_abi_cxx11_(&oldSuffix,(v11 *)".{}.{}",fmt,args);
    local_20 = *(undefined8 *)(this + 8);
    local_28 = *(undefined8 *)(this + 0x10);
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x3;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_28;
    ::fmt::v11::vformat_abi_cxx11_(&newSuffix,(v11 *)0x463a58,fmt_00,args_00);
    __i2._M_current =
         (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (__return_storage_ptr__,
               (__const_iterator)(__i2._M_current + -oldSuffix._M_string_length),__i2,
               (iterator)newSuffix._M_dataplus._M_p,
               (iterator)(newSuffix._M_dataplus._M_p + newSuffix._M_string_length));
    std::__cxx11::string::~string((string *)&newSuffix);
    std::__cxx11::string::~string((string *)&oldSuffix);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string resolveSymbolHierPath(const ast::Symbol& symbol) {

    // Resolve the hierarchical path of the symbol.
    auto buffer = symbol.getHierarchicalPath();

    // Is the symbol is a modport, use the modport name to adjust the
    // hierachical path to match the corresponding variable declaration in the
    // interface.
    if (symbol.kind == ast::SymbolKind::ModportPort) {
        auto const& modportSymbol = symbol.getParentScope()->asSymbol();
        auto& modportName = modportSymbol.name;
        auto oldSuffix = fmt::format(".{}.{}", modportSymbol.name, symbol.name);
        auto newSuffix = fmt::format(".{}", symbol.name);
        DEBUG_PRINT("hierPath={}, oldSuffix={}, newSuffix={}\n", buffer, oldSuffix, newSuffix);
        SLANG_ASSERT(buffer.ends_with(oldSuffix));
        buffer.replace(buffer.end() - (ptrdiff_t)oldSuffix.length(), buffer.end(),
                       newSuffix.begin(), newSuffix.end());
    }

    return buffer;
}